

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
std::vector<unsigned_char,std::allocator<unsigned_char>>::
_M_range_initialize<prevector<28u,unsigned_char,unsigned_int,int>::iterator>
          (vector<unsigned_char,std::allocator<unsigned_char>> *this,void *__first,void *__last)

{
  long lVar1;
  void *__dest;
  ulong uVar2;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (long)__last - (long)__first;
  uVar2 = (ulong)(int)__n;
  if ((long)uVar2 < 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
  }
  else {
    if ((__n & 0xffffffff) == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = operator_new(uVar2);
    }
    *(void **)this = __dest;
    *(ulong *)(this + 0x10) = uVar2 + (long)__dest;
    if (__first != __last) {
      memcpy(__dest,__first,__n);
      __dest = (void *)((long)__dest + __n);
    }
    *(void **)(this + 8) = __dest;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

difference_type friend operator-(iterator a, iterator b) { return (&(*a) - &(*b)); }